

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Expr::emitjumps(Expr *this,string *test,int t,int f)

{
  ostream *poVar1;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  long local_1a8;
  stringstream ss;
  ostream local_198 [376];
  int local_20;
  int local_1c;
  int f_local;
  int t_local;
  string *test_local;
  Expr *this_local;
  
  local_20 = f;
  local_1c = t;
  _f_local = test;
  test_local = (string *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  if ((local_1c == 0) || (local_20 == 0)) {
    if (local_1c == 0) {
      if (local_20 != 0) {
        poVar1 = std::operator<<(local_198,"iffalse ");
        poVar1 = std::operator<<(poVar1,(string *)test);
        poVar1 = std::operator<<(poVar1," goto L");
        std::ostream::operator<<(poVar1,local_20);
        std::__cxx11::stringstream::str();
        Node::emit(&this->super_Node,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
      }
    }
    else {
      poVar1 = std::operator<<(local_198,"if ");
      poVar1 = std::operator<<(poVar1,(string *)test);
      poVar1 = std::operator<<(poVar1," goto L");
      std::ostream::operator<<(poVar1,local_1c);
      std::__cxx11::stringstream::str();
      Node::emit(&this->super_Node,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
    }
  }
  else {
    poVar1 = std::operator<<(local_198,"if ");
    poVar1 = std::operator<<(poVar1,(string *)test);
    poVar1 = std::operator<<(poVar1," goto L");
    std::ostream::operator<<(poVar1,local_1c);
    std::__cxx11::stringstream::str();
    Node::emit(&this->super_Node,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::ios::clear((long)&local_1a8 + *(long *)(local_1a8 + -0x18),0);
    poVar1 = std::operator<<(local_198,"goto L");
    std::ostream::operator<<(poVar1,local_20);
    std::__cxx11::stringstream::str();
    Node::emit(&this->super_Node,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  return;
}

Assistant:

virtual void emitjumps(std::string test, int t, int f) {
		std::stringstream ss;

		if (t != 0 && f != 0) {
			ss << "if " << test << " goto L" << t;
			emit(ss.str());
			ss.clear();
			ss << "goto L" << f;
			emit(ss.str());
		}
		else if (t != 0) {
			ss << "if " << test << " goto L" << t;
			emit(ss.str());
		}
		else if (f != 0) {
			ss << "iffalse " << test << " goto L" << f;
			emit(ss.str());
		}
	}